

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O3

void creatHuffmanCode(HuffmanTree *huffmanTree,HuffmanCode *huffmanCode,int n)

{
  HuffmanTree paVar1;
  uint uVar2;
  void *pvVar3;
  void *__ptr;
  char *__dest;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  size_t __size;
  long lVar8;
  
  uVar6 = n + 1;
  pvVar3 = malloc((long)(int)uVar6 << 3);
  __size = (size_t)n;
  __ptr = malloc(__size);
  *(undefined1 *)((long)__ptr + (__size - 1)) = 0;
  if (n < 1) {
    free(__ptr);
  }
  else {
    paVar1 = *huffmanTree;
    uVar7 = 1;
    do {
      uVar2 = paVar1[uVar7].parent;
      iVar4 = (int)(__size - 1);
      lVar8 = __size - 1;
      if (uVar2 != 0) {
        uVar5 = uVar7 & 0xffffffff;
        lVar8 = (long)(n + -2) + 1;
        do {
          *(byte *)((long)__ptr + lVar8 + -1) = paVar1[(int)uVar2].lchild == (uint)uVar5 ^ 0x31;
          uVar5 = (ulong)uVar2;
          uVar2 = huffmanTree[(int)uVar2]->parent;
          lVar8 = lVar8 + -1;
        } while (uVar2 != 0);
        iVar4 = (int)lVar8;
      }
      __dest = (char *)malloc((long)(n - iVar4));
      *(char **)((long)pvVar3 + uVar7 * 8) = __dest;
      strcpy(__dest,(char *)(lVar8 + (long)__ptr));
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar6);
    free(__ptr);
    if (0 < n) {
      lVar8 = 8;
      do {
        printf("Huffmancode of %3d is %s\n",
               (ulong)*(uint *)((long)&(*huffmanTree)->weight + lVar8 * 2),
               *(undefined8 *)((long)pvVar3 + lVar8));
        lVar8 = lVar8 + 8;
      } while ((ulong)uVar6 << 3 != lVar8);
    }
  }
  putchar(10);
  return;
}

Assistant:

void creatHuffmanCode(HuffmanTree *huffmanTree,HuffmanCode *huffmanCode,int n){
    //指示标记
    int i;
    //编码的起始指针
    int start;
    //编码的起始的父节点
    int p;
    //遍历n个叶子结点的指示标记c
    unsigned int c;
    //分配n个编码的头指针
    huffmanCode = (HuffmanCode *)malloc((n + 1) * sizeof(char *));
    //分配求当前编码的工作空间
    char *cd = (char *)malloc(n * sizeof(char));
    //从右向左逐位存放编码，首先存放编码结束符
    cd[n - 1] = '\0';
    //求n个叶子结点对应的哈夫曼编码
    for (i = 1;i <= n;i++){
        //初始化编码起始指针
        start = n - 1;
        //从叶子到根结点求编码
        for (c = i,p =  (*huffmanTree)[i].parent;p != 0; c = p, p = (*huffmanTree[p]).parent) {
            if ((*huffmanTree)[p].lchild == c) {
                //从右到左的顺序编码入数组内
                cd[--start] = '0';  //左分支标0
            } else {
                cd[--start] = '1';  //右分支标1
            }

        }//为第i个编码分配空间
            huffmanCode[i] = (char *)malloc((n - start) * sizeof(char));

            strcpy(huffmanCode[i],&cd[start]);
    }

        free(cd);
        //打印编码序列
        for(i = 1;i <= n;i++){
            printf("Huffmancode of %3d is %s\n",(*huffmanTree)[i].weight,huffmanCode[i]);
        }

    printf("\n");
}